

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

int xmlRegexpIsDeterminist(xmlRegexpPtr comp)

{
  int iVar1;
  xmlAutomataPtr ctxt;
  long lVar2;
  
  iVar1 = -1;
  if (((comp != (xmlRegexpPtr)0x0) && (iVar1 = comp->determinist, comp->determinist == -1)) &&
     (ctxt = xmlNewAutomata(), iVar1 = -1, ctxt != (xmlAutomataPtr)0x0)) {
    if (ctxt->states != (xmlRegStatePtr *)0x0) {
      for (lVar2 = 0; lVar2 < ctxt->nbStates; lVar2 = lVar2 + 1) {
        xmlRegFreeState(ctxt->states[lVar2]);
      }
      (*xmlFree)(ctxt->states);
    }
    ctxt->nbAtoms = comp->nbAtoms;
    ctxt->atoms = comp->atoms;
    ctxt->nbStates = comp->nbStates;
    ctxt->states = comp->states;
    ctxt->determinist = -1;
    ctxt->flags = comp->flags;
    iVar1 = xmlFAComputesDeterminism(ctxt);
    ctxt->atoms = (xmlRegAtomPtr *)0x0;
    ctxt->states = (xmlRegStatePtr *)0x0;
    xmlRegFreeParserCtxt(ctxt);
    comp->determinist = iVar1;
  }
  return iVar1;
}

Assistant:

int
xmlRegexpIsDeterminist(xmlRegexpPtr comp) {
    xmlAutomataPtr am;
    int ret;

    if (comp == NULL)
	return(-1);
    if (comp->determinist != -1)
	return(comp->determinist);

    am = xmlNewAutomata();
    if (am == NULL)
        return(-1);
    if (am->states != NULL) {
	int i;

	for (i = 0;i < am->nbStates;i++)
	    xmlRegFreeState(am->states[i]);
	xmlFree(am->states);
    }
    am->nbAtoms = comp->nbAtoms;
    am->atoms = comp->atoms;
    am->nbStates = comp->nbStates;
    am->states = comp->states;
    am->determinist = -1;
    am->flags = comp->flags;
    ret = xmlFAComputesDeterminism(am);
    am->atoms = NULL;
    am->states = NULL;
    xmlFreeAutomata(am);
    comp->determinist = ret;
    return(ret);
}